

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O3

void __thiscall QTabBar::removeTab(QTabBar *this,int index)

{
  undefined1 *rect;
  int iVar1;
  SelectionBehavior SVar2;
  QTabBarPrivate *this_00;
  Tab *this_01;
  long lVar3;
  Tab **ppTVar4;
  long lVar5;
  long *plVar6;
  Tab *pTVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  int *piVar12;
  ulong uVar13;
  long in_FS_OFFSET;
  bool bVar14;
  QRect QVar15;
  int local_50 [2];
  void *local_48;
  int *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_50[0] = index;
  if (index < 0) goto LAB_0048bc32;
  this_00 = *(QTabBarPrivate **)&(this->super_QWidget).field_0x8;
  uVar13 = (ulong)(uint)index;
  if ((ulong)(this_00->tabList).d.size <= uVar13) goto LAB_0048bc32;
  this_01 = (this_00->tabList).d.ptr[uVar13];
  pTVar7 = this_01;
  if ((this_00->field_0x2d1 & 2) != 0) {
    QTabBarPrivate::moveTabFinished(this_00,this_00->pressedIndex);
    pTVar7 = (this_00->tabList).d.ptr[uVar13];
  }
  QWidget::releaseShortcut(&this->super_QWidget,pTVar7->shortcutId);
  if (this_01->leftWidget != (QWidget *)0x0) {
    QWidget::hide(this_01->leftWidget);
    QObject::deleteLater();
    this_01->leftWidget = (QWidget *)0x0;
  }
  if (this_01->rightWidget != (QWidget *)0x0) {
    QWidget::hide(this_01->rightWidget);
    QObject::deleteLater();
    this_01->rightWidget = (QWidget *)0x0;
  }
  uVar10 = this_01->lastTab;
  QList<QTabBarPrivate::Tab_*>::removeAt(&this_00->tabList,uVar13);
  QTabBarPrivate::Tab::~Tab(this_01);
  operator_delete(this_01,0xf0);
  lVar3 = (this_00->tabList).d.size;
  if (lVar3 != 0) {
    ppTVar4 = (this_00->tabList).d.ptr;
    lVar9 = 0;
    do {
      lVar5 = *(long *)((long)ppTVar4 + lVar9);
      iVar1 = *(int *)(lVar5 + 0xdc);
      iVar8 = iVar1;
      if (iVar1 == index) {
        iVar8 = -1;
      }
      if (iVar1 == index || index < iVar8) {
        *(uint *)(lVar5 + 0xdc) = iVar8 - (uint)(index < iVar8);
      }
      lVar9 = lVar9 + 8;
    } while (lVar3 << 3 != lVar9);
  }
  QTabBarPrivate::calculateFirstLastVisible(this_00,index,false,true);
  iVar1 = this_00->currentIndex;
  if (iVar1 == index) {
    this_00->currentIndex = -1;
    uVar13 = (this_00->tabList).d.size;
    if (uVar13 != 0) {
      SVar2 = this_00->selectionBehaviorOnRemove;
      if (SVar2 == SelectLeftTab) {
        iVar1 = index + -1;
        local_48 = (void *)CONCAT44(local_48._4_4_,iVar1);
        piVar12 = &this_00->lastVisible;
        iVar8 = this_00->lastVisible;
        if (iVar1 <= iVar8) {
          piVar12 = (int *)&local_48;
          iVar8 = iVar1;
        }
        bVar14 = SBORROW4(this_00->firstVisible,iVar8);
        iVar8 = this_00->firstVisible - iVar8;
LAB_0048bafe:
        if (bVar14 == iVar8 < 0) {
          piVar12 = &this_00->firstVisible;
        }
        uVar10 = *piVar12;
LAB_0048bb0b:
        uVar11 = (ulong)uVar10;
        if ((int)uVar10 < 0) goto LAB_0048bb43;
      }
      else {
        if (SVar2 == SelectRightTab) {
LAB_0048ba9c:
          iVar1 = this_00->lastVisible;
          iVar8 = iVar1;
          if (index <= iVar1) {
            iVar8 = index;
          }
          piVar12 = local_50;
          if (iVar1 < index) {
            piVar12 = &this_00->lastVisible;
          }
          bVar14 = SBORROW4(this_00->firstVisible,iVar8);
          iVar8 = this_00->firstVisible - iVar8;
          goto LAB_0048bafe;
        }
        if (SVar2 != SelectPreviousTab) goto LAB_0048bb0b;
        uVar10 = uVar10 - (index < (int)uVar10);
        if ((((int)uVar10 < 0) || (uVar11 = (ulong)uVar10, uVar13 <= uVar11)) ||
           (((this_00->tabList).d.ptr[uVar11]->field_0xe4 & 2) == 0)) goto LAB_0048ba9c;
      }
      if (uVar11 < uVar13) {
        iVar1 = (this_00->tabList).d.ptr[uVar11]->lastTab;
        setCurrentIndex(this,uVar10);
        (this_00->tabList).d.ptr[uVar11]->lastTab = iVar1;
        goto LAB_0048bb6f;
      }
    }
LAB_0048bb43:
    local_40 = local_50 + 1;
    local_50[1] = 0xffffffff;
    local_48 = (void *)0x0;
    QMetaObject::activate((QObject *)this,&staticMetaObject,0,&local_48);
  }
  else if (index < iVar1) {
    setCurrentIndex(this,iVar1 + -1);
  }
LAB_0048bb6f:
  QTabBarPrivate::refresh(this_00);
  if ((this_00->field_0x2d1 & 8) != 0) {
    plVar6 = *(long **)&(this_00->super_QWidgetPrivate).field_0x8;
    (**(code **)(*plVar6 + 0x68))(plVar6,1 < *(int *)(plVar6[1] + 0x2e8));
  }
  if ((*(int *)&(this_00->super_QWidgetPrivate).field_0x254 <= *(int *)&this_00->field_0x25c) &&
     (*(int *)&this_00->field_0x258 <= *(int *)&this_00->field_0x260)) {
    rect = &(this_00->super_QWidgetPrivate).field_0x254;
    QWidget::update(&this->super_QWidget,(QRect *)rect);
    uVar10 = tabAt(this,&this_00->mousePosition);
    this_00->hoverIndex = uVar10;
    if (((int)uVar10 < 0) || ((ulong)(this_00->tabList).d.size <= (ulong)uVar10)) {
      *(undefined8 *)rect = 0;
      *(undefined8 *)&this_00->field_0x25c = 0xffffffffffffffff;
    }
    else {
      QVar15 = tabRect(this,uVar10);
      *(QRect *)&(this_00->super_QWidgetPrivate).field_0x254 = QVar15;
      QWidget::update(&this->super_QWidget,(QRect *)rect);
    }
  }
  (**(code **)(*(long *)&this->super_QWidget + 0x1b8))(this,index);
LAB_0048bc32:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTabBar::removeTab(int index)
{
    Q_D(QTabBar);
    if (d->validIndex(index)) {
        auto removedTab = d->tabList.at(index);
        if (d->dragInProgress)
            d->moveTabFinished(d->pressedIndex);

#ifndef QT_NO_SHORTCUT
        releaseShortcut(d->tabList.at(index)->shortcutId);
#endif
        if (removedTab->leftWidget) {
            removedTab->leftWidget->hide();
            removedTab->leftWidget->deleteLater();
            removedTab->leftWidget = nullptr;
        }
        if (removedTab->rightWidget) {
            removedTab->rightWidget->hide();
            removedTab->rightWidget->deleteLater();
            removedTab->rightWidget = nullptr;
        }

        int newIndex = removedTab->lastTab;
        d->tabList.removeAt(index);
        delete removedTab;
        for (auto tab : std::as_const(d->tabList)) {
            if (tab->lastTab == index)
                tab->lastTab = -1;
            if (tab->lastTab > index)
                --tab->lastTab;
        }

        d->calculateFirstLastVisible(index, false, true);

        if (index == d->currentIndex) {
            // The current tab is going away, in order to make sure
            // we emit that "current has changed", we need to reset this
            // around.
            d->currentIndex = -1;
            if (d->tabList.size() > 0) {
                switch(d->selectionBehaviorOnRemove) {
                case SelectPreviousTab:
                    if (newIndex > index)
                        newIndex--;
                    if (d->validIndex(newIndex) && d->tabList.at(newIndex)->visible)
                        break;
                    Q_FALLTHROUGH();
                case SelectRightTab:
                    newIndex = qBound(d->firstVisible, index, d->lastVisible);
                    break;
                case SelectLeftTab:
                    newIndex = qBound(d->firstVisible, index-1, d->lastVisible);
                    break;
                default:
                    break;
                }

                if (d->validIndex(newIndex)) {
                    // don't loose newIndex's old through setCurrentIndex
                    int bump = d->tabList.at(newIndex)->lastTab;
                    setCurrentIndex(newIndex);
                    d->tabList.at(newIndex)->lastTab = bump;
                } else {
                    // we had a valid current index, but there are no visible tabs left
                    emit currentChanged(-1);
                }
            } else {
                emit currentChanged(-1);
            }
        } else if (index < d->currentIndex) {
            setCurrentIndex(d->currentIndex - 1);
        }
        d->refresh();
        d->autoHideTabs();
        if (d->hoverRect.isValid()) {
            update(d->hoverRect);
            d->hoverIndex = tabAt(d->mousePosition);
            if (d->validIndex(d->hoverIndex)) {
                d->hoverRect = tabRect(d->hoverIndex);
                update(d->hoverRect);
            } else {
                d->hoverRect = QRect();
            }
        }
        tabRemoved(index);
    }
}